

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

byte * __thiscall slang::BumpAllocator::allocate(BumpAllocator *this,size_t size,size_t alignment)

{
  byte *pbVar1;
  Segment *pSVar2;
  byte *pbVar3;
  
  pbVar1 = (byte *)(-alignment & (ulong)(this->head->current + (alignment - 1)));
  pbVar3 = pbVar1 + size;
  if (pbVar3 <= this->endPtr) {
    this->head->current = pbVar3;
    return pbVar1;
  }
  if (0x800 < size) {
    pSVar2 = allocSegment(this->head->prev,((alignment + size) - 1 & -alignment) + 0x10);
    this->head->prev = pSVar2;
    return (byte *)((ulong)(pSVar2->current + (alignment - 1)) & -alignment);
  }
  pSVar2 = allocSegment(this->head,0x1000);
  this->head = pSVar2;
  this->endPtr = (byte *)(pSVar2 + 0x100);
  pbVar3 = allocate(this,size,alignment);
  return pbVar3;
}

Assistant:

byte* allocate(size_t size, size_t alignment) {
        SLANG_ASSERT(!isFrozen());
        byte* base = alignPtr(head->current, alignment);
        byte* next = base + size;
        if (next > endPtr)
            return allocateSlow(size, alignment);

        head->current = next;
        return base;
    }